

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * getconnectioncount(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  RPCExamples *in_stack_fffffffffffffcc8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffcd0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffcd8;
  string *args;
  string *psVar2;
  allocator<char> *in_stack_fffffffffffffd08;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd10;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 skip_type_check;
  RPCHelpMan *inner;
  RPCResult *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  Type in_stack_fffffffffffffd4c;
  RPCHelpMan *this_01;
  undefined1 local_2a0 [37];
  allocator<char> local_27b;
  undefined1 local_27a;
  undefined1 local_279;
  pointer local_278;
  pointer pRStack_270;
  undefined8 local_268;
  allocator<char> local_252;
  undefined1 local_251 [33];
  size_type sStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  allocator<char> local_212;
  string local_211;
  RPCExamples *in_stack_fffffffffffffe10;
  RPCResults *in_stack_fffffffffffffe18;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  RPCHelpMan *in_stack_fffffffffffffe38;
  RPCMethodImpl *in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = &local_211;
  inner = in_RDI;
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  skip_type_check = (undefined1)((ulong)in_RDI >> 0x38);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  local_251._25_8_ = (pointer)0x0;
  sStack_230 = 0;
  local_228._M_allocated_capacity = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffcc8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  __s = &local_252;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffd08);
  local_278 = (pointer)0x0;
  pRStack_270 = (pointer)0x0;
  local_268 = 0;
  __a = (allocator<char> *)&local_278;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffcc8);
  RPCResult::RPCResult
            ((RPCResult *)this_01,in_stack_fffffffffffffd4c,(string *)in_stack_fffffffffffffd40,
             psVar2,(vector<RPCResult,_std::allocator<RPCResult>_> *)inner,(bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             in_stack_fffffffffffffd40);
  psVar2 = (string *)&local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  args = (string *)&local_27a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  HelpExampleCli(psVar2,args);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  HelpExampleRpc(psVar2,args);
  std::operator+(psVar2,args);
  RPCExamples::RPCExamples(in_stack_fffffffffffffcc8,(string *)0x1343a1b);
  this = (RPCResult *)local_2a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getconnectioncount()::__0,void>(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_ffffffffffffff30);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_2a0 + 0x24));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_27b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_27a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_252);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_251);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_212);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return inner;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getconnectioncount()
{
    return RPCHelpMan{"getconnectioncount",
                "\nReturns the number of connections to other nodes.\n",
                {},
                RPCResult{
                    RPCResult::Type::NUM, "", "The connection count"
                },
                RPCExamples{
                    HelpExampleCli("getconnectioncount", "")
            + HelpExampleRpc("getconnectioncount", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    return connman.GetNodeCount(ConnectionDirection::Both);
},
    };
}